

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O1

DdNode * addBddDoInterval(DdManager *dd,DdNode *f,DdNode *l,DdNode *u)

{
  int *piVar1;
  double dVar2;
  DdHalfWord index;
  DdNode *pDVar3;
  DdNode *n;
  DdNode *T;
  DdNode *pDVar4;
  ulong uVar5;
  
  if (f->index == 0x7fffffff) {
    dVar2 = (f->type).value;
    uVar5 = 1;
    if ((l->type).value <= dVar2) {
      uVar5 = (ulong)((u->type).value <= dVar2 && dVar2 != (u->type).value);
    }
    return (DdNode *)(uVar5 ^ (ulong)dd->one);
  }
  pDVar3 = cuddCacheLookup(dd,0x22,f,l,u);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  index = f->index;
  pDVar3 = (f->type).kids.E;
  n = addBddDoInterval(dd,(f->type).kids.T,l,u);
  if (n != (DdNode *)0x0) {
    T = (DdNode *)((ulong)n & 0xfffffffffffffffe);
    T->ref = T->ref + 1;
    pDVar3 = addBddDoInterval(dd,pDVar3,l,u);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if (((ulong)n & 1) == 0) {
        pDVar4 = n;
        if (n != pDVar3) {
          pDVar4 = cuddUniqueInter(dd,index,n,pDVar3);
        }
        if (pDVar4 != (DdNode *)0x0) {
LAB_007fc1da:
          T->ref = T->ref - 1;
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert(dd,0x22,f,l,u,pDVar4);
          return pDVar4;
        }
        Cudd_RecursiveDeref(dd,n);
        n = pDVar3;
      }
      else {
        pDVar4 = T;
        if (n != pDVar3) {
          pDVar4 = cuddUniqueInter(dd,index,T,(DdNode *)((ulong)pDVar3 ^ 1));
        }
        if (pDVar4 != (DdNode *)0x0) {
          pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
          goto LAB_007fc1da;
        }
        Cudd_RecursiveDeref(dd,n);
        n = pDVar3;
      }
    }
    Cudd_RecursiveDeref(dd,n);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
addBddDoInterval(
  DdManager * dd,
  DdNode * f,
  DdNode * l,
  DdNode * u)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        return(Cudd_NotCond(DD_ONE(dd),cuddV(f) < cuddV(l) || cuddV(f) > cuddV(u)));
    }

    /* Check cache. */
    res = cuddCacheLookup(dd,DD_ADD_BDD_DO_INTERVAL_TAG,f,l,u);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addBddDoInterval(dd,fv,l,u);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addBddDoInterval(dd,fvn,l,u);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);
    if (Cudd_IsComplement(T)) {
        res = (T == E) ? Cudd_Not(T) : cuddUniqueInter(dd,v,Cudd_Not(T),Cudd_Not(E));
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert(dd,DD_ADD_BDD_DO_INTERVAL_TAG,f,l,u,res);

    return(res);

}